

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O0

void __thiscall
TPZAnalysis::PostProcessErrorSerial
          (TPZAnalysis *this,TPZVec<double> *ervec,bool store_error,ostream *out)

{
  int64_t iVar1;
  ostream *poVar2;
  double *pdVar3;
  void *in_RCX;
  TPZVec<double> *in_RSI;
  int ier;
  int nerrors;
  TPZVec<double> *in_stack_000000f0;
  bool in_stack_000000ff;
  TPZCompMesh *in_stack_00000100;
  int local_28;
  
  TPZCompMesh::EvaluateError(in_stack_00000100,in_stack_000000ff,in_stack_000000f0);
  iVar1 = TPZVec<double>::NElements(in_RSI);
  if ((int)iVar1 < 3) {
    poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"TPZAnalysis::PostProcess - At least 3 norms are expected.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = (ostream *)std::ostream::operator<<(in_RCX,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"############");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    for (local_28 = 0; local_28 < (int)iVar1; local_28 = local_28 + 1) {
      poVar2 = (ostream *)std::ostream::operator<<(in_RCX,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<(poVar2,"error ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28);
      poVar2 = std::operator<<(poVar2,"  = ");
      pdVar3 = TPZVec<double>::operator[](in_RSI,(long)local_28);
      std::ostream::operator<<(poVar2,*pdVar3);
    }
  }
  return;
}

Assistant:

void TPZAnalysis::PostProcessErrorSerial(TPZVec<REAL> &ervec, bool store_error, std::ostream &out ){

    fCompMesh->EvaluateError(store_error, ervec);


    const int nerrors = ervec.NElements();

    if (nerrors < 3) {
        PZError << endl << "TPZAnalysis::PostProcess - At least 3 norms are expected." << endl;
        out<<endl<<"############"<<endl;
        for(int ier = 0; ier < nerrors; ier++)
            out << endl << "error " << ier << "  = " << ervec[ier];
    }
    else {
#ifdef PZDEBUG
        out << "############" << endl;
        out << "Norma H1 or L2 -> p = " << ervec[0] << std::endl;
        out << "Norma L2 or L2 -> u = " << ervec[1] << std::endl;
        out << "Semi-norma H1 or L2 -> div = " << ervec[2] << std::endl;
        for (int ier = 3; ier < ervec.size(); ier++)
            out << "other norms = " << ervec[ier] << std::endl;
#endif
    }
}